

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O3

Symbol * __thiscall
slang::ast::anon_unknown_39::findThisHandle
          (anon_unknown_39 *this,Scope *scope,bitmask<slang::ast::LookupFlags> flags,
          SourceRange range,LookupResult *result)

{
  int iVar1;
  SymbolKind SVar2;
  SubroutineSymbol *sub;
  anon_unknown_39 *paVar3;
  Symbol *pSVar4;
  undefined4 in_register_00000014;
  SourceRange range_00;
  
  range_00.startLoc._4_4_ = in_register_00000014;
  range_00.startLoc._0_4_ = flags.m_bits;
  pSVar4 = (Symbol *)this;
  paVar3 = this;
  if (((uint)scope >> 0xc & 1) == 0) {
    do {
      iVar1 = *(int *)paVar3;
      if (iVar1 < 0x40) {
        if (iVar1 != 0x3a) {
          if ((iVar1 == 0x16) && (((uint)scope >> 0xb & 1) == 0)) {
            return *(Symbol **)(paVar3 + 0x88);
          }
          goto LAB_0032a8cc;
        }
      }
      else if (iVar1 != 0x59) goto LAB_0032a895;
      paVar3 = *(anon_unknown_39 **)(*(long *)(paVar3 + 0x20) + 8);
    } while( true );
  }
  while( true ) {
    SVar2 = pSVar4->kind;
    if (SVar2 == ClassType) {
      return pSVar4;
    }
    if (SVar2 == InstanceBody) goto LAB_0032a8cc;
    if (pSVar4->parentScope == (Scope *)0x0) break;
    pSVar4 = pSVar4->parentScope->thisSym;
  }
  if (SVar2 == ClassType) {
    return pSVar4;
  }
LAB_0032a8cc:
  range_00.endLoc = range.startLoc;
  Diagnostics::add((Diagnostics *)((long)range.endLoc + 0x148),(Symbol *)this,(DiagCode)0x16000a,
                   range_00);
  return (Symbol *)0x0;
LAB_0032a895:
  if (iVar1 == 0x40) {
    pSVar4 = *(Symbol **)(paVar3 + 0xd8);
  }
  else {
    if (iVar1 != 0x48) goto LAB_0032a8cc;
    pSVar4 = *(Symbol **)(paVar3 + 0x78);
  }
  if (pSVar4 != (Symbol *)0x0) {
    return pSVar4;
  }
  goto LAB_0032a8cc;
}

Assistant:

const Symbol* findThisHandle(const Scope& scope, bitmask<LookupFlags> flags, SourceRange range,
                             LookupResult& result) {
    if (flags.has(LookupFlags::TypeReference)) {
        // type(this) is allowed to work anywhere within a class, regardless of whether
        // it's a static context or not.
        auto parent = &scope.asSymbol();
        while (parent->kind != SymbolKind::ClassType && parent->kind != SymbolKind::InstanceBody) {
            auto parentScope = parent->getParentScope();
            if (!parentScope)
                break;
            parent = &parentScope->asSymbol();
        }

        if (parent->kind == SymbolKind::ClassType)
            return &parent->as<ClassType>();
    }
    else {
        // Find the parent method, if we can.
        const Symbol* parent = &scope.asSymbol();
        while (parent->kind == SymbolKind::StatementBlock ||
               parent->kind == SymbolKind::RandSeqProduction) {
            auto parentScope = parent->getParentScope();
            SLANG_ASSERT(parentScope);
            parent = &parentScope->asSymbol();
        }

        if (parent->kind == SymbolKind::Subroutine) {
            auto& sub = parent->as<SubroutineSymbol>();
            if (sub.thisVar)
                return sub.thisVar;
        }
        else if (parent->kind == SymbolKind::ConstraintBlock) {
            auto thisVar = parent->as<ConstraintBlockSymbol>().thisVar;
            if (thisVar)
                return thisVar;
        }
        else if (parent->kind == SymbolKind::ClassType &&
                 !flags.has(LookupFlags::StaticInitializer)) {
            return parent->as<ClassType>().thisVar;
        }
    }

    result.addDiag(scope, diag::InvalidThisHandle, range);
    return nullptr;
}